

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O0

void Cmd_printstats(FCommandLine *argv,APlayerPawn *who,int key)

{
  char *pcVar1;
  FString local_28;
  int local_1c;
  APlayerPawn *pAStack_18;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  local_1c = key;
  pAStack_18 = who;
  who_local = (APlayerPawn *)argv;
  StoreLevelStats();
  GetStatString();
  pcVar1 = FString::GetChars(&local_28);
  Printf("%s",pcVar1);
  FString::~FString(&local_28);
  return;
}

Assistant:

CCMD(printstats)
{
	StoreLevelStats();	// Refresh the current level's results.
	Printf("%s", GetStatString().GetChars());
}